

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O2

void __thiscall
cappuccino::
utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
::do_update(utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
            *this,keyed_iterator keyed_position,unsigned_long *value,time_point expire_time)

{
  long lVar1;
  uint in_EAX;
  long lVar2;
  utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
  *this_00;
  __off64_t *in_R8;
  size_t in_R9;
  
  lVar1 = *(long *)(this + 0x38);
  lVar2 = *(long *)((long)keyed_position.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                          ._M_cur + 0x28) * 0x28;
  ((duration *)(lVar1 + lVar2))->__r = (rep)expire_time.__d.__r;
  *(unsigned_long *)(lVar1 + 0x20 + lVar2) = *value;
  this_00 = this + 0xa0;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,(int)this_00,
             (__off64_t *)this_00,(int)*(undefined8 *)(lVar1 + 0x18 + lVar2),in_R8,in_R9,in_EAX);
  do_access(this,(element *)(lVar1 + lVar2));
  return;
}

Assistant:

auto do_update(keyed_iterator keyed_position, value_type&& value, std::chrono::steady_clock::time_point expire_time)
        -> void
    {
        size_t element_idx = keyed_position->second;

        element& e      = m_elements[element_idx];
        e.m_expire_time = expire_time;
        e.m_value       = std::move(value);

        // push to the end of the ttl list
        m_ttl_list.splice(m_ttl_list.end(), m_ttl_list, e.m_ttl_position);

        do_access(e);
    }